

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void __thiscall
benchmark::internal::BenchmarkImp::Ranges
          (BenchmarkImp *this,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *ranges)

{
  long lVar1;
  int iVar2;
  pointer *ppiVar3;
  size_t j;
  int iVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  allocator_type local_81;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  arglists;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ctr;
  vector<int,_std::allocator<int>_> tmp;
  
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&arglists,*(long *)(ranges + 8) - *(long *)ranges >> 3,(allocator_type *)&ctr);
  iVar4 = 1;
  lVar6 = 0;
  uVar5 = 0;
  while( true ) {
    lVar1 = *(long *)ranges;
    if ((ulong)(*(long *)(ranges + 8) - lVar1 >> 3) <= uVar5) break;
    AddRange((vector<int,_std::allocator<int>_> *)
             ((long)&((arglists.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start + lVar6),*(int *)(lVar1 + uVar5 * 8),*(int *)(lVar1 + 4 + uVar5 * 8),
             this->range_multiplier_);
    iVar4 = iVar4 * (int)((ulong)(*(long *)((long)&((arglists.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish + lVar6)
                                 - *(long *)((long)&((arglists.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_start + lVar6))
                         >> 2);
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x18;
  }
  tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&ctr,(long)iVar4,(value_type_conflict2 *)&tmp,&local_81);
  iVar2 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  do {
    if (iVar2 == iVar4) {
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&ctr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&arglists);
      return;
    }
    tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    lVar6 = 0;
    for (uVar5 = 0;
        uVar5 < (ulong)(((long)arglists.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)arglists.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar5 = uVar5 + 1)
    {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 &tmp.super__Vector_base<int,_std::allocator<int>_>,
                 (value_type_conflict *)
                 (ctr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5] * 4 +
                 *(long *)((long)&((arglists.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start + lVar6)));
      lVar6 = lVar6 + 0x18;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&this->args_,(value_type *)&tmp.super__Vector_base<int,_std::allocator<int>_>);
    ppiVar3 = &((arglists.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
    for (lVar6 = 0;
        ((long)arglists.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)arglists.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x18 != lVar6; lVar6 = lVar6 + 1) {
      if (ctr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6] + 1 <
          (ulong)((long)*ppiVar3 - (long)((_Vector_impl_data *)(ppiVar3 + -1))->_M_start >> 2)) {
        ctr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6] =
             ctr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[lVar6] + 1;
        break;
      }
      ctr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6] = 0;
      ppiVar3 = ppiVar3 + 3;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&tmp.super__Vector_base<int,_std::allocator<int>_>);
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void BenchmarkImp::Ranges(const std::vector<std::pair<int, int>>& ranges) {
  std::vector<std::vector<int>> arglists(ranges.size());
  int total = 1;
  for (std::size_t i = 0; i < ranges.size(); i++) {
    AddRange(&arglists[i], ranges[i].first, ranges[i].second, range_multiplier_);
    total *= arglists[i].size();
  }

  std::vector<std::size_t> ctr(total, 0);

  for (int i = 0; i < total; i++) {
    std::vector<int> tmp;

    for (std::size_t j = 0; j < arglists.size(); j++) {
      tmp.push_back(arglists[j][ctr[j]]);
    }

    args_.push_back(tmp);

    for (std::size_t j = 0; j < arglists.size(); j++) {
      if (ctr[j] + 1 < arglists[j].size()) {
        ++ctr[j];
        break;
      }
      ctr[j] = 0;
    }
  }
}